

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.hpp
# Opt level: O2

shared_ptr<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
 __thiscall
inja::Renderer::eval_expression_list_abi_cxx11_(Renderer *this,ExpressionListNode *expression_list)

{
  size_t sVar1;
  AstNode *node;
  size_type sVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _func_int **pp_Var4;
  AstNode *in_RDX;
  shared_ptr<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  sVar5;
  string sStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pp_Var4 = in_RDX[1]._vptr_AstNode;
  if (pp_Var4 == (_func_int **)0x0) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_88,"empty expression",(allocator<char> *)&local_68);
    throw_renderer_error((Renderer *)expression_list,&sStack_88,in_RDX);
    ::std::__cxx11::string::~string((string *)&sStack_88);
    pp_Var4 = in_RDX[1]._vptr_AstNode;
  }
  (**(code **)*pp_Var4)(pp_Var4,expression_list);
  if (expression_list[6].root.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == expression_list[5].root.
                super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_88,"empty expression",(allocator<char> *)&local_68);
    throw_renderer_error((Renderer *)expression_list,&sStack_88,in_RDX);
  }
  else {
    sVar2 = std::
            deque<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
            ::size((deque<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                    *)(expression_list + 5));
    if (sVar2 == 1) goto LAB_0014743a;
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_88,"malformed expression",(allocator<char> *)&local_68);
    throw_renderer_error((Renderer *)expression_list,&sStack_88,in_RDX);
  }
  ::std::__cxx11::string::~string((string *)&sStack_88);
LAB_0014743a:
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           expression_list[6].root.
           super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (p_Var3 == expression_list[6].root.
                super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi) {
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)(expression_list[7].super_AstNode.pos - 8) + 0x200);
  }
  sVar1 = *(size_t *)&p_Var3[-1]._M_use_count;
  std::
  deque<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
  ::pop_back((deque<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
              *)(expression_list + 5));
  if (sVar1 == 0) {
    pp_Var4 = expression_list[9].super_AstNode._vptr_AstNode;
    if (pp_Var4 == expression_list[8].super_AstNode._vptr_AstNode) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_88,"expression could not be evaluated",
                 (allocator<char> *)&local_68);
      throw_renderer_error((Renderer *)expression_list,&sStack_88,in_RDX);
      ::std::__cxx11::string::~string((string *)&sStack_88);
      pp_Var4 = expression_list[9].super_AstNode._vptr_AstNode;
    }
    if (pp_Var4 == (_func_int **)expression_list[9].super_AstNode.pos) {
      pp_Var4 = (_func_int **)
                (*(long *)&expression_list[9].root.
                           super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi[-1]._M_use_count + 0x200);
    }
    node = (AstNode *)pp_Var4[-1];
    std::deque<const_inja::DataNode_*,_std::allocator<const_inja::DataNode_*>_>::pop_back
              ((deque<const_inja::DataNode_*,_std::allocator<const_inja::DataNode_*>_> *)
               &expression_list[7].root);
    ::std::__cxx11::string::string((string *)&local_48,(string *)(node + 1));
    ::std::operator+(&local_68,"variable \'",&local_48);
    ::std::operator+(&sStack_88,&local_68,"\' not found");
    throw_renderer_error((Renderer *)expression_list,&sStack_88,node);
    ::std::__cxx11::string::~string((string *)&sStack_88);
    ::std::__cxx11::string::~string((string *)&local_68);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  sVar5 = ::std::
          make_shared<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)this);
  sVar5.
  super___shared_ptr<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
          )sVar5.
           super___shared_ptr<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

const std::shared_ptr<json> eval_expression_list(const ExpressionListNode& expression_list) {
    if (!expression_list.root) {
      throw_renderer_error("empty expression", expression_list);
    }

    expression_list.root->accept(*this);

    if (data_eval_stack.empty()) {
      throw_renderer_error("empty expression", expression_list);
    } else if (data_eval_stack.size() != 1) {
      throw_renderer_error("malformed expression", expression_list);
    }

    const auto result = data_eval_stack.top();
    data_eval_stack.pop();

    if (!result) {
      if (not_found_stack.empty()) {
        throw_renderer_error("expression could not be evaluated", expression_list);
      }

      const auto node = not_found_stack.top();
      not_found_stack.pop();

      throw_renderer_error("variable '" + static_cast<std::string>(node->name) + "' not found", *node);
    }
    return std::make_shared<json>(*result);
  }